

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void I422ToRGB565Row_SSSE3
               (uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_rgb565,
               YuvConstants *yuvconstants,int width)

{
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  YuvConstants *in_R8;
  int in_R9D;
  int twidth;
  uint8_t row [8192];
  int local_2068;
  uint8_t local_2060 [8196];
  int local_5c;
  YuvConstants *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  local_58 = in_R8;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  for (local_5c = in_R9D; 0 < local_5c; local_5c = local_5c - local_2068) {
    if (local_5c < 0x801) {
      local_2068 = local_5c;
    }
    else {
      local_2068 = 0x800;
    }
    I422ToARGBRow_SSSE3(local_38,local_40,local_48,local_2060,local_58,local_2068);
    ARGBToRGB565Row_SSE2(local_2060,local_50,local_2068);
    local_38 = local_38 + local_2068;
    local_40 = local_40 + local_2068 / 2;
    local_48 = local_48 + local_2068 / 2;
    local_50 = local_50 + (local_2068 << 1);
  }
  return;
}

Assistant:

void I422ToRGB565Row_SSSE3(const uint8_t* src_y,
                           const uint8_t* src_u,
                           const uint8_t* src_v,
                           uint8_t* dst_rgb565,
                           const struct YuvConstants* yuvconstants,
                           int width) {
  SIMD_ALIGNED(uint8_t row[MAXTWIDTH * 4]);
  while (width > 0) {
    int twidth = width > MAXTWIDTH ? MAXTWIDTH : width;
    I422ToARGBRow_SSSE3(src_y, src_u, src_v, row, yuvconstants, twidth);
    ARGBToRGB565Row_SSE2(row, dst_rgb565, twidth);
    src_y += twidth;
    src_u += twidth / 2;
    src_v += twidth / 2;
    dst_rgb565 += twidth * 2;
    width -= twidth;
  }
}